

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O2

void __thiscall cmNinjaTargetGenerator::ScanningFiles::~ScanningFiles(ScanningFiles *this)

{
  std::__cxx11::string::~string((string *)&this->ModuleMapFile);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

bool IsEmpty() const
    {
      return this->ScanningOutput.empty() && this->ModuleMapFile.empty();
    }